

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analyser.cpp
# Opt level: O2

void __thiscall Analyser::addVariable(Analyser *this,string *var,bool isConstant)

{
  int iVar1;
  iterator iVar2;
  string *psVar3;
  mapped_type *pmVar4;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<bool,_int>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<bool,_int>_>_>_>
  *this_00;
  allocator<char> local_69;
  string local_68 [32];
  string local_48 [32];
  
  iVar1 = this->_localIndex;
  if (this->_currentFunction == -1) {
    this_00 = &this->_globalVars;
    iVar2 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<bool,_int>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<bool,_int>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<bool,_int>_>_>_>
            ::find(&this_00->_M_t,var);
    if ((_Rb_tree_header *)iVar2._M_node != &(this->_globalVars)._M_t._M_impl.super__Rb_tree_header)
    {
      psVar3 = (string *)__cxa_allocate_exception(0x28);
      std::__cxx11::string::string<std::allocator<char>>
                (local_48,"this identifier has been declared",&local_69);
      iVar1 = this->_currentLine;
      std::__cxx11::string::string(psVar3,local_48);
      *(long *)(psVar3 + 0x20) = (long)iVar1;
      __cxa_throw(psVar3,&Error::typeinfo,Error::~Error);
    }
  }
  else {
    this_00 = &this->_localVars;
    iVar2 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<bool,_int>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<bool,_int>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<bool,_int>_>_>_>
            ::find(&this_00->_M_t,var);
    if ((_Rb_tree_header *)iVar2._M_node != &(this->_localVars)._M_t._M_impl.super__Rb_tree_header)
    {
      psVar3 = (string *)__cxa_allocate_exception(0x28);
      std::__cxx11::string::string<std::allocator<char>>
                (local_68,"this identifier has been declared",&local_69);
      iVar1 = this->_currentLine;
      std::__cxx11::string::string(psVar3,local_68);
      *(long *)(psVar3 + 0x20) = (long)iVar1;
      __cxa_throw(psVar3,&Error::typeinfo,Error::~Error);
    }
  }
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<bool,_int>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<bool,_int>_>_>_>
           ::operator[](this_00,var);
  pmVar4->first = isConstant;
  pmVar4->second = iVar1;
  this->_localIndex = this->_localIndex + 1;
  return;
}

Assistant:

void Analyser::addVariable(const std::string& var, bool isConstant) {
	std::pair<bool, std::int32_t> valStruct(isConstant, _localIndex);
	if (_currentFunction == -1) {
		if (_globalVars.find(var) != _globalVars.end()) {
			throw Error("this identifier has been declared", _currentLine);
		}
		else {
			_globalVars[var] = valStruct;
		}
	}
	else {
		if (_localVars.find(var) != _localVars.end()) {
			throw Error("this identifier has been declared", _currentLine);
		}
		else {
			_localVars[var] = valStruct;
		}
	}
	_localIndex++;
}